

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

Vec_Ptr_t * getVecOfVecFairness(FILE *fp)

{
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  char stringBuffer [100];
  char acStack_88 [112];
  
  pVVar1 = (Vec_Ptr_t *)calloc(1,0x10);
  do {
    pcVar2 = fgets(acStack_88,0x32,(FILE *)fp);
  } while (pcVar2 != (char *)0x0);
  return pVVar1;
}

Assistant:

Vec_Ptr_t *getVecOfVecFairness(FILE *fp)
{
	Vec_Ptr_t *masterVector = Vec_PtrAlloc(0);
	//Vec_Ptr_t *currSignalVector;
	char stringBuffer[100];
	//int i;
	
	while(fgets(stringBuffer, 50, fp))
	{
		if(strstr(stringBuffer, ":"))
		{

		}
		else
		{
				
		}
	}

	return masterVector;
}